

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ClockingBlockSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ClockingBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2)

{
  string_view name;
  ClockingBlockSymbol *this_00;
  
  this_00 = (ClockingBlockSymbol *)allocate(this,0xc0,8);
  name._M_len = args_1->_M_len;
  name._M_str = args_1->_M_str;
  ast::ClockingBlockSymbol::ClockingBlockSymbol(this_00,args,name,*args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }